

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_chaiscript::File_Position_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_chaiscript::File_Position_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node>_>
           *this,Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node> f)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  _func_File_Position_ptr_AST_Node_ptr *in_stack_00000018;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffc0;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffc8;
  Proxy_Function_Impl_Base *in_stack_ffffffffffffffd0;
  
  dispatch::detail::
  build_param_type_list<chaiscript::File_Position_const&,chaiscript::AST_Node_const&>
            (in_stack_00000018);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector
            (in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__Proxy_Function_Callable_Impl_005ca518;
  in_RDI[5] = in_RSI;
  in_RDI[6] = in_RDX;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }